

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  _func_int **pp_Var1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_00;
  pointer *pppcVar2;
  ulong uVar3;
  iterator __position;
  cmGeneratorTarget *target;
  cmake *pcVar4;
  string *psVar5;
  pointer pcVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  TargetType TVar10;
  PolicyStatus PVar11;
  undefined8 *puVar12;
  string *psVar13;
  ostream *poVar14;
  string *c;
  pointer ppcVar15;
  undefined8 uVar16;
  cmExportBuildFileGenerator *pcVar17;
  pointer pbVar18;
  pointer pbVar19;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar20;
  string expectedTargets;
  cmGeneratorTarget *te;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  undefined1 local_288 [32];
  ostream *local_268;
  cmGeneratorTarget *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  cmExportBuildFileGenerator *local_1f0;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [376];
  
  local_288._0_8_ = local_288 + 0x10;
  local_288._8_8_ = 0;
  local_288[0x10] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_268 = os;
  GetTargets(this,&local_1c8);
  pbVar19 = local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_238 = &(this->super_cmExportFileGenerator).Namespace;
    this_00 = &(this->super_cmExportFileGenerator).ExportedTargets;
    local_1f0 = (cmExportBuildFileGenerator *)&this->Exports;
    pbVar18 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar8 = 0;
    do {
      bVar7 = bVar8;
      local_260 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,pbVar18);
      std::operator+(&local_258,&local_210,local_238);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_230,local_260);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        uVar16 = local_258.field_2._M_allocated_capacity;
      }
      uVar3 = (long)(_func_int ***)local_230._M_string_length + local_258._M_string_length;
      if ((ulong)uVar16 < uVar3) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar16 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < uVar3) goto LAB_0044f9af;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_230,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      }
      else {
LAB_0044f9af:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_258,(ulong)local_230._M_dataplus._M_p);
      }
      pp_Var1 = (_func_int **)(puVar12 + 2);
      if ((_func_int **)*puVar12 == pp_Var1) {
        local_1a8._16_8_ = *pp_Var1;
        local_1a8._24_8_ = puVar12[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *pp_Var1;
        local_1a8._0_8_ = (_func_int **)*puVar12;
      }
      local_1a8._8_8_ = puVar12[1];
      *puVar12 = pp_Var1;
      puVar12[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append(local_288,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,
                        (ulong)((long)(_Rb_tree_color *)local_1a8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_210,0,(char *)local_210._M_string_length,0x77f92e);
      pcVar17 = (cmExportBuildFileGenerator *)this_00;
      pVar20 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)this_00,&local_260);
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(local_260);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                             psVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" more than once.",0x11);
        pcVar4 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_258,(cmListFileBacktrace *)&local_230);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        bVar9 = false;
        goto LAB_0044fc4f;
      }
      __position._M_current =
           (this->Exports).
           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->Exports).
          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pcVar17 = local_1f0;
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        _M_realloc_insert<cmGeneratorTarget*const&>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)local_1f0,
                   __position,&local_260);
      }
      else {
        *__position._M_current = local_260;
        pppcVar2 = &(this->Exports).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar2 = *pppcVar2 + 1;
      }
      TVar10 = GetExportTargetType(pcVar17,local_260);
      pbVar18 = pbVar18 + 1;
      bVar8 = bVar7 | TVar10 == INTERFACE_LIBRARY;
    } while (pbVar18 != pbVar19);
    if ((bool)(bVar7 | TVar10 == INTERFACE_LIBRARY)) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_268,"3.0.0");
    }
  }
  bVar9 = true;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_268,local_288);
LAB_0044fc4f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  pcVar17 = (cmExportBuildFileGenerator *)local_288._0_8_;
  if ((cmExportBuildFileGenerator *)local_288._0_8_ !=
      (cmExportBuildFileGenerator *)(local_288 + 0x10)) {
    operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
  }
  if (bVar9) {
    ppcVar15 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this->Exports).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppcVar15 != local_238)
    {
      do {
        target = *ppcVar15;
        GetExportTargetType(pcVar17,target);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,local_268,target)
        ;
        cmTarget::AppendBuildInterfaceIncludes(target->Target);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = (_Base_ptr)0x0;
        local_1a8._24_8_ = local_1a8 + 8;
        local_1a8._40_8_ = 0;
        pcVar17 = (cmExportBuildFileGenerator *)(local_288 + 0x10);
        local_288._0_8_ = pcVar17;
        local_1a8._32_8_ = local_1a8._24_8_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"INTERFACE_SOURCES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_PRECOMPILE_HEADERS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_288,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_288,target,
                   (ImportPropertyMap *)local_1a8);
        if ((cmExportBuildFileGenerator *)local_288._0_8_ != pcVar17) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        local_288._8_8_ = 0;
        local_288[0x10] = '\0';
        local_288._0_8_ = pcVar17;
        bVar9 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8,
                           (string *)local_288);
        if (bVar9) {
          PVar11 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
          if ((PVar11 != WARN) &&
             (PVar11 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar11 != OLD)) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,target,BuildInterface,
                       (ImportPropertyMap *)local_1a8);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,target,local_268);
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,target,local_268,(cmTargetExport *)0x0);
        }
        else {
          pcVar4 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar4,FATAL_ERROR,(string *)local_288,
                              (cmListFileBacktrace *)&local_210);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length);
          }
        }
        if ((cmExportBuildFileGenerator *)local_288._0_8_ !=
            (cmExportBuildFileGenerator *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,CONCAT71(local_288._17_7_,local_288[0x10]) + 1);
        }
        pcVar17 = (cmExportBuildFileGenerator *)local_1a8;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)pcVar17);
        if (!bVar9) goto LAB_00450237;
        ppcVar15 = ppcVar15 + 1;
      } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppcVar15 !=
               local_238);
    }
    poVar14 = local_268;
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,local_268);
    psVar13 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar13 != psVar5) {
      do {
        cmExportFileGenerator::GenerateImportConfig
                  (&this->super_cmExportFileGenerator,poVar14,psVar13);
        psVar13 = psVar13 + 1;
      } while (psVar13 != psVar5);
      pbVar19 = (this->super_cmExportFileGenerator).Configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar18 = (this->super_cmExportFileGenerator).Configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar19 != pbVar18) {
        do {
          pcVar6 = (pbVar19->_M_dataplus)._M_p;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar6,pcVar6 + pbVar19->_M_string_length);
          GenerateImportCxxModuleConfigTargetInclusion(this,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._0_8_ + 1);
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar18);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,poVar14);
    bVar9 = true;
  }
  else {
LAB_00450237:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);

    this->GenerateTargetFileSets(gte, os);
  }

  this->GenerateCxxModuleInformation(os);

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportCxxModuleConfigTargetInclusion(c);
  }

  this->GenerateMissingTargetsCheckCode(os);

  return true;
}